

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dns_resolve.cpp
# Opt level: O1

void __thiscall DNSResolve::HandleEvent(DNSResolve *this,SOCKET s,int event)

{
  bool bVar1;
  int iVar2;
  time_t tVar3;
  _List_node_base *p_Var4;
  int addr_len;
  sockaddr_in addr;
  char recv_data [1024];
  int local_44c;
  char *local_448;
  long local_440;
  char local_438 [16];
  sockaddr local_428;
  char *local_418;
  long local_410;
  char local_408 [1008];
  
  if (this->dns_socket_ != s) {
    Log::GetInstance();
    Log::FormatTime_abi_cxx11_();
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,local_418,local_410);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," [error] ",9);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"handle event from a error socket\n",0x21);
    if (local_418 == local_408) {
      return;
    }
    operator_delete(local_418);
    return;
  }
  if ((event & 8U) != 0) {
    Log::GetInstance();
    Log::FormatTime_abi_cxx11_();
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,local_418,local_410);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," [info] ",8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"dns socket error",0x10);
    if (local_418 != local_408) {
      operator_delete(local_418);
    }
    EventLoop::Remove(this->event_loop_,this->dns_socket_);
    iVar2 = socket(2,2,0x11);
    this->dns_socket_ = iVar2;
    SetNoBlocking(iVar2);
    EventLoop::Add(this->event_loop_,this->dns_socket_,1,&this->super_ISockNotify);
    goto LAB_0011284f;
  }
  local_44c = 0x10;
  BufferRecvFrom(s,(char *)&local_418,0x400,&local_428,&local_44c);
  bVar1 = false;
  p_Var4 = (_List_node_base *)&this->servers_;
  do {
    p_Var4 = (((_List_base<sockaddr_in,_std::allocator<sockaddr_in>_> *)&p_Var4->_M_next)->_M_impl).
             _M_node.super__List_node_base._M_next;
    if (p_Var4 == (_List_node_base *)&this->servers_) goto LAB_0011264f;
  } while (local_428.sa_data._2_4_ != *(int *)((long)&p_Var4[1]._M_next + 4));
  bVar1 = true;
LAB_0011264f:
  if (bVar1) {
    iVar2 = HandleData(this,(char *)&local_418);
    if (iVar2 != 0) {
      Log::GetInstance();
      Log::FormatTime_abi_cxx11_();
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,local_448,local_440);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," [warning] ",0xb);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"resolve dns failed\n",0x13);
      goto LAB_00112836;
    }
  }
  else {
    Log::GetInstance();
    Log::FormatTime_abi_cxx11_();
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,local_448,local_440);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," [warning] ",0xb);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"received a packet other than our dns\n",0x25);
LAB_00112836:
    if (local_448 != local_438) {
      operator_delete(local_448);
    }
  }
  if (!bVar1) {
    return;
  }
LAB_0011284f:
  tVar3 = time((time_t *)0x0);
  if (0x1d < tVar3 - this->last_time_) {
    LRUCache<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::Sweep(&this->dns_cache_);
    this->last_time_ = tVar3;
  }
  return;
}

Assistant:

void DNSResolve::HandleEvent(SOCKET s, int event)
{
    if (s != dns_socket_)
    {
        LOGE << "handle event from a error socket\n";
        return;
    }
    if (event & kPollErr)
    {
        //socket error,create new
        LOGI << "dns socket error";
        event_loop_->Remove(dns_socket_);
        dns_socket_ = socket(AF_INET, SOCK_DGRAM, IPPROTO_UDP);
        SetNoBlocking(dns_socket_);
        event_loop_->Add(dns_socket_, kPollIn, this);
    }
    else
    {
        char recv_data[1024];
        sockaddr_in addr;
        int addr_len = sizeof(sockaddr_in);
        BufferRecvFrom(s, recv_data, 1024, (sockaddr*)&addr, &addr_len);
        //check packet is from our dns server
        bool find = false;
        for (auto& dns_server_addr : servers_)
        {
            if (addr.sin_addr.s_addr ==
                    dns_server_addr.sin_addr.s_addr)
            {
                find = true;
                break;
            }
        }
        if (!find)
        {
            LOGW << "received a packet other than our dns\n";
            return;
        }
        if (0 != HandleData(recv_data))
        {
            LOGW << "resolve dns failed\n";
        }
    }
    time_t now = time(NULL);
    if (now - this->last_time_ >= kCacheSweepInterval)
    {
        dns_cache_.Sweep();
        this->last_time_ = now;
    }
}